

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O1

int tagFUNCTION::CompareFunctionName(wchar_t *a,int a_count,wchar_t *b)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint in_EAX;
  wchar_t wVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = 0 < a_count;
  if (0 < a_count) {
    wVar1 = *a;
    wVar3 = *b;
    b = b + 1;
    wVar2 = wVar1 | 0x20;
    if (0x19 < (uint)(wVar1 + L'\xffffffbf')) {
      wVar2 = wVar1;
    }
    in_EAX = 0xffffffff;
    if (wVar3 <= wVar2) {
      uVar4 = 1;
      do {
        if (wVar3 < wVar2) {
          in_EAX = 1;
          break;
        }
        if (wVar2 == L'\0') {
          in_EAX = 0;
          break;
        }
        bVar5 = uVar4 < (uint)a_count;
        if (uVar4 == (uint)a_count) break;
        wVar1 = a[uVar4];
        wVar3 = *b;
        b = b + 1;
        wVar2 = wVar1 | 0x20;
        if (0x19 < (uint)(wVar1 + L'\xffffffbf')) {
          wVar2 = wVar1;
        }
        uVar4 = uVar4 + 1;
      } while (wVar3 <= wVar2);
    }
  }
  if (!bVar5) {
    in_EAX = 0xffffffff;
    if (*b < L'\x01') {
      in_EAX = (uint)(*b != L'\0');
    }
  }
  return in_EAX;
}

Assistant:

static int CompareFunctionName(
    const wchar_t* a,
    int a_count,
    const wchar_t* b
    )
  {
    wchar_t c, d=0;
    for ( int a_index = 0; a_index < a_count; a_index++ )
    {
      c = a[a_index];
      d = *b++;
      if ( c >= 'A' && c <= 'Z' )
        c += 'a'-'A';
      if ( c < d )
        return -1;
      if ( c > d )
        return 1;
      if ( 0 == c )
        return 0;
    }
    d = *b++;
    if ( 0 < d )
      return -1;
    if ( 0 > d )
      return 1;
    return 0;
  }